

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall Parser::match(Parser *this,TokenType type)

{
  TokenType TVar1;
  pointer pcVar2;
  long *local_50 [2];
  long local_40 [2];
  unsigned_long local_30;
  unsigned_long uStack_28;
  
  TVar1 = (this->currentToken).type;
  pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
  local_30 = (this->currentToken).line;
  uStack_28 = (this->currentToken).col;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return TVar1 == type;
}

Assistant:

bool Parser::match(TokenType type) {
    return token().type == type;
}